

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void av1_cdef_frame_mt(AV1_COMMON *cm,MACROBLOCKD *xd,AV1CdefWorkerData *cdef_worker,
                      AVxWorker *workers,AV1CdefSync *cdef_sync,int num_workers,
                      cdef_init_fb_row_t cdef_init_fb_row_fn,int do_extend_border)

{
  long lVar1;
  uint8_t uVar2;
  AVxWorker *pAVar3;
  int iVar4;
  AVxWorkerInterface *pAVar5;
  uint16_t **ppuVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  AVxWorker *pAVar10;
  int iVar11;
  AVxWorker *worker;
  bool bVar12;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  bVar12 = cm->seq_params->monochrome == '\0';
  av1_setup_dst_planes
            (xd->plane,cm->seq_params->sb_size,&cm->cur_frame->buf,0,0,0,bVar12 + 1 + (uint)bVar12);
  *(undefined8 *)((long)&cdef_sync->fbr + 1) = 0;
  cdef_sync->end_of_frame = 0;
  cdef_sync->fbr = 0;
  uVar2 = cm->seq_params->monochrome;
  cdef_worker->srcbuf = (cm->cdef_info).srcbuf;
  lVar1 = (ulong)(uVar2 == '\0') * 2 + 1;
  for (lVar7 = 0; lVar1 != lVar7; lVar7 = lVar7 + 1) {
    cdef_worker->colbuf[lVar7] = (cm->cdef_info).colbuf[lVar7];
  }
  uVar8 = (ulong)(uint)num_workers;
  ppuVar6 = cdef_worker[uVar8 - 1].linebuf;
  uVar9 = uVar8;
  while (0 < (int)uVar9) {
    uVar9 = uVar9 - 1;
    cdef_worker[uVar9].cm = cm;
    cdef_worker[uVar9].xd = xd;
    cdef_worker[uVar9].cdef_init_fb_row_fn = cdef_init_fb_row_fn;
    cdef_worker[uVar9].do_extend_border = do_extend_border;
    for (lVar7 = 0; lVar1 != lVar7; lVar7 = lVar7 + 1) {
      ppuVar6[lVar7] = (cm->cdef_info).linebuf[lVar7];
    }
    workers[uVar9].hook = cdef_sb_row_worker_hook;
    workers[uVar9].data1 = cdef_sync;
    workers[uVar9].data2 = cdef_worker + uVar9;
    ppuVar6 = ppuVar6 + -0x3f;
  }
  pAVar5 = aom_get_worker_interface();
  pAVar3 = workers + uVar8;
  for (uVar9 = uVar8; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
    pAVar3[-1].had_error = 0;
    (*(&pAVar5->launch)[uVar9 == 1])(pAVar3 + -1);
    pAVar3 = pAVar3 + -1;
  }
  pAVar5 = aom_get_worker_interface();
  iVar11 = workers->had_error;
  if (iVar11 != 0) {
    memcpy(&local_1d0,(void *)((long)workers->data2 + 0x58),0x1a0);
  }
  bVar12 = iVar11 == 0;
  do {
    iVar11 = (int)uVar8 + 1;
    pAVar3 = workers + (uVar8 - 1);
    do {
      pAVar10 = pAVar3;
      iVar11 = iVar11 + -1;
      if (iVar11 < 2) {
        if (!bVar12) {
          aom_internal_error_copy(cm->error,&local_1d0);
        }
        return;
      }
      uVar8 = uVar8 - 1;
      iVar4 = (*pAVar5->sync)(pAVar10);
      pAVar3 = pAVar10 + -1;
    } while (iVar4 != 0);
    memcpy(&local_1d0,(void *)((long)pAVar10->data2 + 0x58),0x1a0);
    bVar12 = false;
  } while( true );
}

Assistant:

void av1_cdef_frame_mt(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                       AV1CdefWorkerData *const cdef_worker,
                       AVxWorker *const workers, AV1CdefSync *const cdef_sync,
                       int num_workers, cdef_init_fb_row_t cdef_init_fb_row_fn,
                       int do_extend_border) {
  YV12_BUFFER_CONFIG *frame = &cm->cur_frame->buf;
  const int num_planes = av1_num_planes(cm);

  av1_setup_dst_planes(xd->plane, cm->seq_params->sb_size, frame, 0, 0, 0,
                       num_planes);

  reset_cdef_job_info(cdef_sync);
  prepare_cdef_frame_workers(cm, xd, cdef_worker, cdef_sb_row_worker_hook,
                             workers, cdef_sync, num_workers,
                             cdef_init_fb_row_fn, do_extend_border);
  launch_cdef_workers(workers, num_workers);
  sync_cdef_workers(workers, cm, num_workers);
}